

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O0

void print_options(superlu_options_t *options)

{
  superlu_options_t *options_local;
  
  printf(".. options:\n");
  printf("\tFact\t %8d\n",(ulong)options->Fact);
  printf("\tEquil\t %8d\n",(ulong)options->Equil);
  printf("\tColPerm\t %8d\n",(ulong)options->ColPerm);
  printf("\tDiagPivotThresh %8.4f\n",options->DiagPivotThresh);
  printf("\tTrans\t %8d\n",(ulong)options->Trans);
  printf("\tIterRefine\t%4d\n",(ulong)options->IterRefine);
  printf("\tSymmetricMode\t%4d\n",(ulong)options->SymmetricMode);
  printf("\tPivotGrowth\t%4d\n",(ulong)options->PivotGrowth);
  printf("\tConditionNumber\t%4d\n",(ulong)options->ConditionNumber);
  printf("..\n");
  return;
}

Assistant:

void print_options(const superlu_options_t *options)
{
    printf(".. options:\n");
    printf("\tFact\t %8d\n", options->Fact);
    printf("\tEquil\t %8d\n", options->Equil);
    printf("\tColPerm\t %8d\n", options->ColPerm);
    printf("\tDiagPivotThresh %8.4f\n", options->DiagPivotThresh);
    printf("\tTrans\t %8d\n", options->Trans);
    printf("\tIterRefine\t%4d\n", options->IterRefine);
    printf("\tSymmetricMode\t%4d\n", options->SymmetricMode);
    printf("\tPivotGrowth\t%4d\n", options->PivotGrowth);
    printf("\tConditionNumber\t%4d\n", options->ConditionNumber);
    printf("..\n");
}